

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
::find_in_range<std::__cxx11::string>
          (basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
           *this,range_type *r,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  pointer __s2;
  size_t sVar1;
  iterator pcVar2;
  size_t __n;
  int iVar3;
  iterator unaff_RBX;
  iterator pcVar4;
  bool bVar5;
  
  pcVar4 = r->first;
  if (pcVar4 != (iterator)0x0) {
    __s2 = (k->_M_dataplus)._M_p;
    sVar1 = k->_M_string_length;
    pcVar2 = r->second;
    do {
      __n = (pcVar4->val).first._M_string_length;
      if (__n == sVar1) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp((pcVar4->val).first._M_dataplus._M_p,__s2,__n);
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (pcVar4 == pcVar2) {
        unaff_RBX = (iterator)0x0;
      }
      if (bVar5) {
        return pcVar4;
      }
      if (pcVar4 == pcVar2) {
        return unaff_RBX;
      }
      pcVar4 = pcVar4->next;
    } while (pcVar4 != (container *)0x0);
  }
  return (iterator)0x0;
}

Assistant:

iterator find_in_range(range_type &r,Kt const &k)
	{
		for(iterator p=r.first;p!=0;p=p->next) {
			Equals compare;
			if(compare(p->val.first,k)) {
				return p;
			}
			if(p==r.second)
				return 0;
		}
		return 0;
	}